

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetLinSysFnBS(void *cvode_mem,int which,CVLsLinSysFnBS linsysBS)

{
  int iVar1;
  code *linsys;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVLsMemB local_28;
  CVodeBMem local_20;
  CVadjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetLinSysFnBS",&local_10,&local_18,&local_20,
                           &local_28);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_28->linsysBS = linsysBS;
  if (linsysBS == (CVLsLinSysFnBS)0x0) {
    linsys = (CVLsLinSysFn)0x0;
  }
  else {
    linsys = cvLsLinSysBSWrapper;
  }
  iVar1 = CVodeSetLinSysFn(local_20->cv_mem,linsys);
  return iVar1;
}

Assistant:

int CVodeSetLinSysFnBS(void* cvode_mem, int which, CVLsLinSysFnBS linsysBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  void* cvodeB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* set linsysB function pointer */
  cvlsB_mem->linsysBS = linsysBS;

  /* call corresponding routine for cvodeB_mem structure */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  if (linsysBS != NULL)
  {
    retval = CVodeSetLinSysFn(cvodeB_mem, cvLsLinSysBSWrapper);
  }
  else { retval = CVodeSetLinSysFn(cvodeB_mem, NULL); }

  return (retval);
}